

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotation_t *
opengv::relative_pose::ge
          (RelativeAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices,
          geOutput_t *output,bool useWeights)

{
  Indices *in_RDI;
  Indices idx;
  undefined1 in_stack_00002447;
  geOutput_t *in_stack_00002448;
  Indices *in_stack_00002450;
  RelativeAdapterBase *in_stack_00002458;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  
  Indices::Indices(in_RDI,in_stack_ffffffffffffffa8);
  ge(in_stack_00002458,in_stack_00002450,in_stack_00002448,(bool)in_stack_00002447);
  return (rotation_t *)in_RDI;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::ge(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices,
    geOutput_t & output,
    bool useWeights )
{
  Indices idx(indices);
  return ge(adapter,idx,output,useWeights);
}